

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

PromiseFulfillerPair<void> * kj::newPromiseAndFulfiller<void>(void)

{
  RefOrVoid<kj::_::WeakFulfiller<void>_> params;
  Own<kj::_::PromiseNode> *pOVar1;
  void *pvVar2;
  Promise<void> *pPVar3;
  Own<kj::_::WeakFulfiller<void>_> *other;
  PromiseFulfillerPair<void> *in_RDI;
  void *local_68;
  undefined1 local_60 [8];
  ReducePromises<void> promise;
  Own<kj::_::AdapterPromiseNode<kj::_::Void,_kj::_::PromiseAndFulfillerAdapter<void>_>_> local_40;
  undefined1 local_30 [8];
  Own<kj::_::PromiseNode> intermediate;
  Own<kj::_::WeakFulfiller<void>_> wrapper;
  
  _::WeakFulfiller<void>::make();
  params = Own<kj::_::WeakFulfiller<void>_>::operator*
                     ((Own<kj::_::WeakFulfiller<void>_> *)&intermediate.ptr);
  heap<kj::_::AdapterPromiseNode<kj::_::Void,kj::_::PromiseAndFulfillerAdapter<void>>,kj::_::WeakFulfiller<void>&>
            ((kj *)&local_40,params);
  Own<kj::_::PromiseNode>::
  Own<kj::_::AdapterPromiseNode<kj::_::Void,kj::_::PromiseAndFulfillerAdapter<void>>,void>
            ((Own<kj::_::PromiseNode> *)local_30,&local_40);
  Own<kj::_::AdapterPromiseNode<kj::_::Void,_kj::_::PromiseAndFulfillerAdapter<void>_>_>::~Own
            (&local_40);
  pOVar1 = mv<kj::Own<kj::_::PromiseNode>>((Own<kj::_::PromiseNode> *)local_30);
  local_68 = (void *)0x0;
  pvVar2 = implicitCast<void*,decltype(nullptr)>(&local_68);
  pOVar1 = _::maybeChain<void>(pOVar1,pvVar2);
  Promise<void>::Promise((Promise<void> *)local_60,false,pOVar1);
  pPVar3 = mv<kj::Promise<void>>((Promise<void> *)local_60);
  Promise<void>::Promise(&in_RDI->promise,pPVar3);
  other = mv<kj::Own<kj::_::WeakFulfiller<void>>>
                    ((Own<kj::_::WeakFulfiller<void>_> *)&intermediate.ptr);
  Own<kj::PromiseFulfiller<void>>::Own<kj::_::WeakFulfiller<void>,void>
            ((Own<kj::PromiseFulfiller<void>> *)&in_RDI->fulfiller,other);
  Promise<void>::~Promise((Promise<void> *)local_60);
  Own<kj::_::PromiseNode>::~Own((Own<kj::_::PromiseNode> *)local_30);
  Own<kj::_::WeakFulfiller<void>_>::~Own((Own<kj::_::WeakFulfiller<void>_> *)&intermediate.ptr);
  return in_RDI;
}

Assistant:

PromiseFulfillerPair<T> newPromiseAndFulfiller() {
  auto wrapper = _::WeakFulfiller<T>::make();

  Own<_::PromiseNode> intermediate(
      heap<_::AdapterPromiseNode<_::FixVoid<T>, _::PromiseAndFulfillerAdapter<T>>>(*wrapper));
  _::ReducePromises<T> promise(false,
      _::maybeChain(kj::mv(intermediate), implicitCast<T*>(nullptr)));

  return PromiseFulfillerPair<T> { kj::mv(promise), kj::mv(wrapper) };
}